

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_parse_coordinate_system(REF_GRID ref_grid,char *coordinate_system)

{
  int iVar1;
  bool bVar2;
  char *coordinate_system_local;
  REF_GRID ref_grid_local;
  
  ref_grid->coordinate_system = REF_GRID_COORDSYS_LAST;
  iVar1 = strcmp("xByUzL",coordinate_system);
  if (iVar1 == 0) {
    ref_grid->coordinate_system = REF_GRID_XBYUZL;
  }
  iVar1 = strcmp("xByRzU",coordinate_system);
  if (iVar1 == 0) {
    ref_grid->coordinate_system = REF_GRID_XBYRZU;
  }
  iVar1 = strcmp("xFyRzD",coordinate_system);
  if (iVar1 == 0) {
    ref_grid->coordinate_system = REF_GRID_XFYRZD;
  }
  bVar2 = ref_grid->coordinate_system == REF_GRID_COORDSYS_LAST;
  if (bVar2) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xe4,
           "ref_grid_parse_coordinate_system","coordinate_system not recognized");
  }
  ref_grid_local._4_4_ = (uint)bVar2;
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_parse_coordinate_system(
    REF_GRID ref_grid, const char *coordinate_system) {
  ref_grid_coordinate_system(ref_grid) = REF_GRID_COORDSYS_LAST;
  if (0 == strcmp("xByUzL", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYUZL;
  if (0 == strcmp("xByRzU", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XBYRZU;
  if (0 == strcmp("xFyRzD", coordinate_system))
    ref_grid_coordinate_system(ref_grid) = REF_GRID_XFYRZD;
  RUS(REF_GRID_COORDSYS_LAST, ref_grid_coordinate_system(ref_grid),
      "coordinate_system not recognized");
  return REF_SUCCESS;
}